

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O0

void __thiscall
c74::min::
attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
::attribute_threadsafe_helper
          (attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
           *this,attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
                 *an_attribute)

{
  t_qelem *ptVar1;
  attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
  *an_attribute_local;
  attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
  *this_local;
  
  this->m_attribute = an_attribute;
  Catch::clara::std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::vector
            ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)&this->m_value);
  ptVar1 = (t_qelem *)
           qelem_new(this,
                     attribute_threadsafe_helper_qfn<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>
                    );
  this->m_qelem = ptVar1;
  return;
}

Assistant:

explicit attribute_threadsafe_helper(attribute<T, threadsafe::no, limit_type, repetitions>* an_attribute)
        : m_attribute(an_attribute)
    {
        m_qelem = (max::t_qelem*)max::qelem_new(this, (max::method)attribute_threadsafe_helper_qfn<T, threadsafe::no, limit_type, repetitions>);
    }